

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O2

uint __thiscall
FuncInfo::FindOrAddInlineCacheId
          (FuncInfo *this,RegSlot instanceSlot,PropertyId propertySlot,bool isLoadMethod,
          bool isStore)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Type *pTVar4;
  SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *this_01;
  ArenaAllocator *pAVar5;
  BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_58;
  InlineCacheIdMap *properties;
  RegSlot instanceSlot_local;
  PropertyId propertySlot_local;
  InlineCacheList *cacheList;
  undefined4 uStack_38;
  uint local_34 [2];
  uint cacheId;
  
  properties._0_4_ = instanceSlot;
  properties._4_4_ = propertySlot;
  if (instanceSlot == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x294,"(instanceSlot != Js::Constants::NoRegister)",
                       "instanceSlot != Js::Constants::NoRegister");
    if (!bVar2) goto LAB_0077404e;
    *puVar3 = 0;
  }
  if (propertySlot == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x295,"(propertySlot != Js::Constants::NoProperty)",
                       "propertySlot != Js::Constants::NoProperty");
    if (!bVar2) goto LAB_0077404e;
    *puVar3 = 0;
  }
  if (isLoadMethod && isStore) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x296,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar2) goto LAB_0077404e;
    *puVar3 = 0;
  }
  if (isStore) {
    if (propertySlot == 0x178) {
      local_34[0] = NewInlineCache(this);
      pAVar5 = this->alloc;
      this_01 = &this->toStringStoreCacheIds;
    }
    else {
      if (propertySlot != 0x18e) goto LAB_00773e15;
      local_34[0] = NewInlineCache(this);
      pAVar5 = this->alloc;
      this_01 = &this->valueOfStoreCacheIds;
    }
    SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Prepend(this_01,pAVar5,local_34);
  }
  else {
LAB_00773e15:
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>(this->inlineCacheMap,(uint *)&properties,&local_58);
    if (!bVar2) {
      this_00 = (BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::ArenaAllocator>(0x38,this->alloc,0x35916e);
      JsUtil::
      BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_00,this->alloc,0x11);
      local_58 = this_00;
      JsUtil::
      BaseDictionary<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->inlineCacheMap,(uint *)&properties,&local_58);
    }
    bVar2 = JsUtil::
            BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<int>(local_58,(int *)((long)&properties + 4),
                               (SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> **)
                               &instanceSlot_local);
    if (!bVar2) {
      _instanceSlot_local =
           (SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> *)
           new<Memory::ArenaAllocator>(0x18,this->alloc,0x35916e);
      pAVar5 = this->alloc;
      (_instanceSlot_local->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)_instanceSlot_local;
      (_instanceSlot_local->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
      super_RealCount.count = 0;
      _instanceSlot_local->allocator = pAVar5;
      JsUtil::
      BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)local_58,(int *)((long)&properties + 4),
                 (SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> **)&instanceSlot_local);
    }
    if ((DAT_0145c367 == 1) &&
       (1 < (_instanceSlot_local->
            super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).super_RealCount.
            count)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                         ,0x2be,
                         "(!Js::FunctionBody::ShouldShareInlineCaches() || cacheList->Count() <= 1)"
                         ,"!Js::FunctionBody::ShouldShareInlineCaches() || cacheList->Count() <= 1")
      ;
      if (!bVar2) {
LAB_0077404e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    cacheList._4_4_ = 0xffffffff;
    uStack_38 = 0xffffffff;
    if (((DAT_0145c367 & 1) == 0) ||
       ((SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> *)
        (_instanceSlot_local->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == _instanceSlot_local)) {
      local_34[0] = NewInlineCache(this);
      cacheList._0_4_ = local_34[0];
      if (DAT_0145c367 == 1) {
        if (isLoadMethod) {
          cacheList._0_4_ = 0xffffffff;
          uStack_38 = 0xffffffff;
          cacheList._4_4_ = local_34[0];
        }
        else if (isStore) {
          cacheList._0_4_ = 0xffffffff;
          cacheList._4_4_ = 0xffffffff;
          uStack_38 = local_34[0];
        }
        else {
          cacheList._4_4_ = 0xffffffff;
          uStack_38 = 0xffffffff;
        }
      }
      SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Prepend
                (_instanceSlot_local,(InlineCacheUnit *)&cacheList);
    }
    else {
      pTVar4 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Head
                         (&_instanceSlot_local->
                           super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>);
      cacheList._0_4_ = (uint)*(undefined8 *)&pTVar4->field_0;
      cacheList._4_4_ = (uint)((ulong)*(undefined8 *)&pTVar4->field_0 >> 0x20);
      uStack_38 = (pTVar4->field_0).field_0.storeCacheId;
      if (isLoadMethod) {
        local_34[0] = cacheList._4_4_;
        if (cacheList._4_4_ == 0xffffffff) {
          cacheList._4_4_ = NewInlineCache(this);
          local_34[0] = cacheList._4_4_;
        }
      }
      else if (isStore) {
        local_34[0] = uStack_38;
        if (uStack_38 == 0xffffffff) {
          local_34[0] = NewInlineCache(this);
          uStack_38 = local_34[0];
        }
      }
      else {
        local_34[0] = (uint)cacheList;
        if ((uint)cacheList == 0xffffffff) {
          local_34[0] = NewInlineCache(this);
          cacheList._0_4_ = local_34[0];
        }
      }
      pTVar4 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Head
                         (&_instanceSlot_local->
                           super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>);
      *(ulong *)&pTVar4->field_0 = CONCAT44(cacheList._4_4_,(uint)cacheList);
      (pTVar4->field_0).field_0.storeCacheId = uStack_38;
    }
  }
  return local_34[0];
}

Assistant:

uint FindOrAddInlineCacheId(Js::RegSlot instanceSlot, Js::PropertyId propertySlot, bool isLoadMethod, bool isStore)
    {
        Assert(instanceSlot != Js::Constants::NoRegister);
        Assert(propertySlot != Js::Constants::NoProperty);
        Assert(!isLoadMethod || !isStore);

        InlineCacheIdMap *properties;
        uint cacheId;

        if (isStore)
        {
            // ... = foo.toString;
            // foo.toString = ...;

            // We need a new cache here to ensure SetProperty() is called, which will set the side-effect bit
            // on the scriptContext.
            switch (propertySlot)
            {
            case Js::PropertyIds::valueOf:
                cacheId = this->NewInlineCache();
                valueOfStoreCacheIds.Prepend(alloc, cacheId);
                return cacheId;

            case Js::PropertyIds::toString:
                cacheId = this->NewInlineCache();
                toStringStoreCacheIds.Prepend(alloc, cacheId);
                return cacheId;
            };
        }

        if (!inlineCacheMap->TryGetValue(instanceSlot, &properties))
        {
            properties = Anew(alloc, InlineCacheIdMap, alloc, 17);
            inlineCacheMap->Add(instanceSlot, properties);
        }

        InlineCacheList* cacheList;
        if (!properties->TryGetValue(propertySlot, &cacheList))
        {
            cacheList = Anew(alloc, InlineCacheList, alloc);
            properties->Add(propertySlot, cacheList);
        }

        // If we share inline caches we should never have more than one entry in the list.
        Assert(!Js::FunctionBody::ShouldShareInlineCaches() || cacheList->Count() <= 1);

        InlineCacheUnit cacheIdUnit;

        if (Js::FunctionBody::ShouldShareInlineCaches() && !cacheList->Empty())
        {
            cacheIdUnit = cacheList->Head();
            if (isLoadMethod)
            {
                if (cacheIdUnit.loadMethodCacheId == (uint)-1)
                {
                    cacheIdUnit.loadMethodCacheId = this->NewInlineCache();
                }
                cacheId = cacheIdUnit.loadMethodCacheId;
            }
            else if (isStore)
            {
                if (cacheIdUnit.storeCacheId == (uint)-1)
                {
                    cacheIdUnit.storeCacheId = this->NewInlineCache();
                }
                cacheId = cacheIdUnit.storeCacheId;
            }
            else
            {
                if (cacheIdUnit.loadCacheId == (uint)-1)
                {
                    cacheIdUnit.loadCacheId = this->NewInlineCache();
                }
                cacheId = cacheIdUnit.loadCacheId;
            }
            cacheList->Head() = cacheIdUnit;
        }
        else
        {
            cacheId = this->NewInlineCache();
            if (Js::FunctionBody::ShouldShareInlineCaches())
            {
                if (isLoadMethod)
                {
                    cacheIdUnit.loadCacheId = (uint)-1;
                    cacheIdUnit.loadMethodCacheId = cacheId;
                    cacheIdUnit.storeCacheId = (uint)-1;
                }
                else if (isStore)
                {
                    cacheIdUnit.loadCacheId = (uint)-1;
                    cacheIdUnit.loadMethodCacheId = (uint)-1;
                    cacheIdUnit.storeCacheId = cacheId;
                }
                else
                {
                    cacheIdUnit.loadCacheId = cacheId;
                    cacheIdUnit.loadMethodCacheId = (uint)-1;
                    cacheIdUnit.storeCacheId = (uint)-1;
                }
            }
            else
            {
                cacheIdUnit.cacheId = cacheId;
            }
            cacheList->Prepend(cacheIdUnit);
        }

        return cacheId;
    }